

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall
MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::push
          (VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *this)

{
  VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *this_local;
  
  this->needPush = true;
  this->stackFrame = this->stackFrame + 1;
  return;
}

Assistant:

bool pop() {
    stackFrame--;
    if (pushed && (stackFrame > 0)) {
      value.pop_front();
      attrList.pop_front();
      pushed = false;
    };
    // A value with a stackFrame zero or less should be cleaned up.
    // It would have been added to the data index in a context that no
    // longer exists.  Use the return value from this function to
    // indicate a datum should be cleaned up.
    return (stackFrame <= 0);
  }